

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O2

time_t curl_getdate(char *p,time_t *now)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  ushort **ppuVar7;
  int *piVar8;
  long lVar9;
  size_t sVar10;
  ulong uVar11;
  byte bVar12;
  byte *pbVar13;
  char *pcVar14;
  bool bVar15;
  ulong uVar16;
  char **what;
  char **ppcVar17;
  uint uVar18;
  long lVar19;
  bool bVar20;
  bool bVar21;
  char *pcStack_90;
  uint local_84;
  uint local_7c;
  int local_78;
  int minnum;
  int hournum;
  uint local_6c;
  ulong local_68;
  uint local_5c;
  char *end;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  byte *local_38;
  
  hournum = -1;
  minnum = -1;
  local_78 = -1;
  local_84 = 0xffffffff;
  bVar21 = false;
  local_68 = 0xffffffff;
  uVar18 = 0;
  uVar16 = 0xffffffff;
  lVar19 = 0xffffffff;
  local_7c = local_84;
  local_38 = (byte *)p;
  do {
    bVar12 = *p;
    uVar5 = (uint)uVar16;
    if ((bVar12 == 0) || (5 < uVar18)) {
      if (local_78 == -1) {
        hournum = 0;
        minnum = 0;
        local_78 = 0;
      }
      iVar6 = (int)local_68;
      if (((local_7c != 0xffffffff) && (uVar5 != 0xffffffff)) && (iVar6 != -1)) {
        if (iVar6 < 0x7b2) {
          return 0;
        }
        if (((local_78 < 0x3d) && ((int)local_7c < 0x20)) &&
           (((int)uVar5 < 0xc && ((hournum < 0x18 && (minnum < 0x3c)))))) {
          if ((int)uVar5 < 0) {
            iVar6 = (0xb - uVar5) / 0xc + iVar6;
            uVar16 = (ulong)(0xb - (0xb - uVar5) % 0xc);
          }
          uVar18 = iVar6 - (uint)((int)uVar5 < 2);
          lVar19 = (((long)hournum +
                    ((long)(int)local_7c + (ulong)(iVar6 - 0x7b2) * 0x16d +
                     (long)*(int *)(my_timegm_month_days_cumulative + uVar16 * 4) +
                    (long)(int)(uVar18 / 400 + ((uVar18 >> 2) - uVar18 / 100) + -0x1dd)) * 0x18) *
                    0x3c + (long)minnum) * 0x3c;
          if (local_84 == 0xffffffff) {
            local_84 = 0;
          }
          lVar9 = 0;
          if ((int)lVar19 + local_78 != 0x1517f) {
            lVar9 = (long)(int)local_84;
          }
          return lVar9 + lVar19 + local_78 + -0x15180;
        }
      }
      return -1;
    }
    ppuVar7 = __ctype_b_loc();
    pcVar14 = (char *)0x0;
    while (bVar12 != 0) {
      uVar1 = (*ppuVar7)[bVar12];
      if ((uVar1 & 8) != 0) goto LAB_0043cd06;
      pcVar4 = pcVar14 + 1;
      pcVar14 = pcVar14 + 1;
      bVar12 = ((byte *)p)[(long)pcVar4];
    }
    uVar1 = **ppuVar7;
LAB_0043cd06:
    pbVar13 = (byte *)p + (long)pcVar14;
    if ((uVar1 >> 10 & 1) == 0) {
      if ((uVar1 >> 0xb & 1) != 0) {
        local_6c = uVar18;
        if (local_78 == -1) {
          iVar6 = __isoc99_sscanf(pbVar13,"%02d:%02d:%02d",&hournum,&minnum,&local_78);
          if (iVar6 == 3) {
            pcVar14 = pcVar14 + 8;
          }
          else {
            if ((local_78 != -1) ||
               (iVar6 = __isoc99_sscanf(pbVar13,"%02d:%02d",&hournum,&minnum), iVar6 != 2))
            goto LAB_0043cd33;
            pcVar14 = pcVar14 + 5;
            local_78 = 0;
          }
          pbVar13 = (byte *)p + (long)pcVar14;
          uVar18 = local_6c;
        }
        else {
LAB_0043cd33:
          local_5c = uVar5;
          piVar8 = __errno_location();
          iVar6 = *piVar8;
          *piVar8 = 0;
          lVar9 = strtol((char *)pbVar13,&end,10);
          uVar18 = local_5c;
          iVar2 = *piVar8;
          if (iVar2 != iVar6) {
            *piVar8 = iVar6;
          }
          uVar16 = (ulong)local_5c;
          if (iVar2 != 0) {
            return -1;
          }
          if (lVar9 - 0x80000000U < 0xffffffff00000000) {
            return -1;
          }
          uVar5 = curlx_sltosi(lVar9);
          uVar11 = (ulong)uVar5;
          pcStack_90 = end + (-(long)pcVar14 - (long)p);
          if (local_84 == 0xffffffff) {
            bVar3 = false;
            if (pbVar13 <= local_38) {
              local_84 = 0xffffffff;
              goto LAB_0043cdb7;
            }
            if (end + (-4 - (long)p) == pcVar14) {
              local_84 = 0xffffffff;
              if ((int)uVar5 < 0x579) {
                bVar12 = ((byte *)p)[(long)(pcVar14 + -1)];
                if ((bVar12 != 0x2d) && (bVar12 != 0x2b)) {
                  pcStack_90 = (char *)0x4;
                  goto LAB_0043d0fa;
                }
                iVar6 = ((int)uVar5 / 100) * 0x3c + (int)uVar5 % 100;
                local_84 = iVar6 * -0x3c;
                if (bVar12 != 0x2b) {
                  local_84 = iVar6 * 0x3c;
                }
                bVar3 = true;
                pcStack_90 = (char *)0x4;
              }
            }
            else {
LAB_0043d0fa:
              bVar3 = false;
              local_84 = 0xffffffff;
            }
          }
          else {
LAB_0043cdb7:
            bVar3 = false;
          }
          if ((((pcStack_90 == (char *)0x8) && ((int)local_68 == -1)) && (uVar18 == 0xffffffff)) &&
             (local_7c == 0xffffffff)) {
            local_68 = (long)(int)uVar5 / 10000 & 0xffffffff;
            uVar16 = (ulong)(uint)(int)(short)((short)((long)(int)uVar5 % 10000) / 100 + -1);
            local_7c = (int)uVar5 % 100;
            bVar3 = true;
          }
          bVar15 = (bool)(local_7c == 0xffffffff & !bVar21 & ~bVar3);
          bVar20 = uVar5 - 1 < 0x1f;
          uVar18 = 0xffffffff;
          if (bVar20) {
            uVar18 = uVar5;
          }
          bVar20 = (bool)(bVar20 & bVar15);
          if (bVar15) {
            bVar21 = true;
            local_7c = uVar18;
          }
          pbVar13 = (byte *)end;
          uVar18 = local_6c;
          if (((bVar20 || bVar3) || (!bVar21)) || ((int)local_68 != -1)) {
            if (!bVar20 && !bVar3) {
              return -1;
            }
          }
          else {
            if ((int)uVar5 < 0x76c) {
              if ((int)uVar5 < 0x47) {
                uVar11 = (ulong)(uVar5 + 2000);
              }
              else {
                uVar11 = (ulong)(uVar5 + 0x76c);
              }
            }
            bVar21 = local_7c != 0xffffffff;
            local_68 = uVar11;
          }
        }
      }
    }
    else {
      local_48 = 0;
      uStack_40 = 0;
      end = (char *)0x0;
      uStack_50 = 0;
      iVar6 = __isoc99_sscanf(pbVar13,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &end);
      if (iVar6 == 0) {
        sVar10 = 0;
        local_6c = uVar18;
      }
      else {
        local_6c = uVar18;
        sVar10 = strlen((char *)&end);
      }
      if ((int)lVar19 == -1) {
        ppcVar17 = Curl_wkday;
        if (3 < sVar10) {
          ppcVar17 = weekday;
        }
        for (lVar19 = 0; (int)lVar19 != 7; lVar19 = lVar19 + 1) {
          iVar6 = Curl_raw_equal((char *)&end,ppcVar17[lVar19]);
          if (iVar6 != 0) goto LAB_0043d05f;
        }
        lVar19 = 0xffffffff;
      }
      if (uVar5 == 0xffffffff) {
        ppcVar17 = Curl_month;
        for (uVar18 = 0; uVar18 != 0xc; uVar18 = uVar18 + 1) {
          uVar16 = (ulong)uVar18;
          iVar6 = Curl_raw_equal((char *)&end,*ppcVar17);
          if (iVar6 != 0) goto LAB_0043d05f;
          ppcVar17 = ppcVar17 + 1;
        }
        uVar5 = 0xffffffff;
      }
      if (local_84 != 0xffffffff) {
        return -1;
      }
      uVar16 = (ulong)uVar5;
      lVar9 = 0;
      while( true ) {
        if ((int)lVar9 == 0x330) {
          return -1;
        }
        iVar6 = Curl_raw_equal((char *)&end,tz[0].name + lVar9);
        if (iVar6 != 0) break;
        lVar9 = lVar9 + 0xc;
      }
      local_84 = *(int *)(tz[0].name + lVar9 + 8) * 0x3c;
LAB_0043d05f:
      pbVar13 = (byte *)p + (long)(pcVar14 + sVar10);
      uVar18 = local_6c;
    }
    uVar18 = uVar18 + 1;
    p = (char *)pbVar13;
  } while( true );
}

Assistant:

time_t curl_getdate(const char *p, const time_t *now)
{
  time_t parsed;
  int rc = parsedate(p, &parsed);
  (void)now; /* legacy argument from the past that we ignore */

  switch(rc) {
  case PARSEDATE_OK:
  case PARSEDATE_LATER:
  case PARSEDATE_SOONER:
    return parsed;
  }
  /* everything else is fail */
  return -1;
}